

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void check_bin_z85<zmq::sockopt::array_option<49,2>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  int value;
  uchar *puVar1;
  undefined8 uVar2;
  unsigned_long value_00;
  size_type sVar3;
  void *__s1;
  Decomposer local_3a5;
  ExprLhs<int> local_3a4;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<int,_int>,_capture_by_value<int>_>::value,_BinaryExpr<int,_int>_>
  local_3a0;
  StringRef local_378;
  SourceLineInfo local_368;
  StringRef local_358;
  undefined1 local_348 [8];
  AssertionHandler catchAssertionHandler_3;
  ExprLhs<unsigned_long> local_2f8;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<unsigned_long,_unsigned_long>,_capture_by_value<unsigned_long>_>::value,_BinaryExpr<unsigned_long,_unsigned_long>_>
  local_2f0;
  StringRef local_2c0;
  SourceLineInfo local_2b0;
  StringRef local_2a0;
  undefined1 local_290 [8];
  AssertionHandler catchAssertionHandler_2;
  string local_240 [8];
  string bv;
  ExprLhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_218;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<basic_string<char>_&,_basic_string<char>_&>,_Detail::negation<capture_by_value<std::remove_reference_t<basic_string<char>_&>_>_>_>::value,_BinaryExpr<basic_string<char>_&,_basic_string<char>_&>_>
  local_210;
  StringRef local_1e0;
  SourceLineInfo local_1d0;
  StringRef local_1c0;
  undefined1 local_1b0 [8];
  AssertionHandler catchAssertionHandler_1;
  undefined1 local_160 [8];
  string sv;
  const_buffer local_130;
  void *local_118;
  Decomposer local_109;
  ExprLhs<unsigned_char_*const_&> local_108;
  enable_if_t<Detail::conjunction<Detail::is_ne_comparable<unsigned_char_*const_&,_std::nullptr_t>,_Detail::negation<capture_by_value<std::remove_reference_t<std::nullptr_t>_>_>_>::value,_BinaryExpr<unsigned_char_*const_&,_const_std::nullptr_t_&>_>
  local_100;
  StringRef local_d0;
  SourceLineInfo local_c0;
  StringRef local_b0;
  undefined1 local_a0 [8];
  AssertionHandler catchAssertionHandler;
  uint8_t *dret;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bin_val;
  string *str_val_local;
  socket_t *sock_local;
  
  bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)param_2;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x20,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  uVar2 = std::__cxx11::string::c_str();
  catchAssertionHandler.m_resultCapture = (IResultCapture *)zmq_z85_decode(puVar1,uVar2);
  local_b0 = operator____catch_sr("CHECK",5);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0x77);
  local_d0 = operator____catch_sr("dret != nullptr",0xf);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_a0,local_b0,&local_c0,local_d0,ContinueOnFailure);
  local_108 = Catch::operator<=<unsigned_char_*const_&,_0>
                        (&local_109,(uchar **)&catchAssertionHandler.m_resultCapture);
  local_118 = (void *)0x0;
  Catch::operator!=(&local_100,&local_108,&local_118);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_a0,&local_100.super_ITransientExpression);
  Catch::BinaryExpr<unsigned_char_*const_&,_const_std::nullptr_t_&>::~BinaryExpr(&local_100);
  Catch::AssertionHandler::complete((AssertionHandler *)local_a0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_a0);
  zmq::detail::socket_base::set<49,2>(param_1,param_2);
  join_0x00000010_0x00000000_ =
       zmq::buffer<unsigned_char,std::allocator<unsigned_char>>
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  zmq::const_buffer::const_buffer(&local_130,(mutable_buffer *)((long)&sv.field_2 + 8));
  zmq::detail::socket_base::set<49,2>(param_1,local_130._data,local_130._size);
  zmq::detail::socket_base::get<49,2>(local_160,param_1,0x400);
  local_1c0 = operator____catch_sr("CHECK",5);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0x7c);
  local_1e0 = operator____catch_sr("sv == str_val",0xd);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1b0,local_1c0,&local_1d0,local_1e0,ContinueOnFailure);
  local_218 = Catch::
              operator<=<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                        ((Decomposer *)(bv.field_2._M_local_buf + 0xf),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160);
  Catch::operator==(&local_210,&local_218,param_2);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_1b0,&local_210.super_ITransientExpression);
  Catch::
  BinaryExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~BinaryExpr(&local_210);
  Catch::AssertionHandler::complete((AssertionHandler *)local_1b0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1b0);
  zmq::detail::socket_base::get<49,2>(local_240,param_1,0x20);
  local_2a0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2b0,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0x7f);
  local_2c0 = operator____catch_sr("bv.size() == bin_val.size()",0x1b);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_290,local_2a0,&local_2b0,local_2c0,Normal);
  value_00 = std::__cxx11::string::size();
  local_2f8 = Catch::operator<=<unsigned_long,_0>
                        ((Decomposer *)((long)&catchAssertionHandler_3.m_resultCapture + 7),value_00
                        );
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  Catch::operator==(&local_2f0,&local_2f8,sVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_290,&local_2f0.super_ITransientExpression);
  Catch::BinaryExpr<unsigned_long,_unsigned_long>::~BinaryExpr(&local_2f0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_290);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_290);
  local_358 = operator____catch_sr("CHECK",5);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_368,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0x80);
  local_378 = operator____catch_sr
                        ("std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0",0x3b);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_348,local_358,&local_368,local_378,ContinueOnFailure);
  __s1 = (void *)std::__cxx11::string::data();
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  value = memcmp(__s1,puVar1,sVar3);
  local_3a4 = Catch::operator<=<int,_0>(&local_3a5,value);
  Catch::operator==(&local_3a0,&local_3a4,0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_348,&local_3a0.super_ITransientExpression);
  Catch::BinaryExpr<int,_int>::~BinaryExpr(&local_3a0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_348);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_348);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string((string *)local_160);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void check_bin_z85(T opt, zmq::socket_t &sock, std::string str_val)
{
    std::vector<uint8_t> bin_val(32);
    const auto dret = zmq_z85_decode(bin_val.data(), str_val.c_str());
    CHECK(dret != nullptr);

    sock.set(opt, str_val);
    sock.set(opt, zmq::buffer(bin_val));
    auto sv = sock.get(opt);
    CHECK(sv == str_val);

    auto bv = sock.get(opt, 32);
    REQUIRE(bv.size() == bin_val.size());
    CHECK(std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0);
}